

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *coefficients)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *coefficients_local;
  Polynomial<double> *this_local;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->coefficients_,coefficients);
  removeHighOrderZeroCoefficients(this);
  updateOrderAndSize(this);
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::vector<Complex>& coefficients) :
            coefficients_(coefficients) {

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }